

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

void crnlib::etc1_block::get_diff_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color5,uint table_idx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uchar uVar11;
  uchar uVar12;
  
  uVar7 = (ulong)table_idx;
  uVar5 = packed_color5 >> 7 & 0xf8 | packed_color5 >> 0xc & 7;
  uVar4 = packed_color5 >> 2 & 0xf8 | packed_color5 >> 7 & 7;
  iVar1 = (packed_color5 >> 2 & 7) + (packed_color5 & 0x1f) * 8;
  iVar9 = (&g_etc1_inten_tables)[uVar7 * 4];
  iVar6 = iVar9 + uVar5;
  iVar8 = iVar9 + uVar4;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  iVar10 = 0;
  if (iVar6 < 1) {
    iVar6 = iVar10;
  }
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  if (iVar8 < 1) {
    iVar8 = iVar10;
  }
  iVar2 = (&DAT_001ac584)[uVar7 * 4];
  iVar3 = iVar9 + iVar1;
  if (0xfe < iVar9 + iVar1) {
    iVar3 = 0xff;
  }
  (pDst->field_0).field_0.r = (uchar)iVar6;
  if (iVar3 < 1) {
    iVar3 = iVar10;
  }
  (pDst->field_0).field_0.g = (uchar)iVar8;
  (pDst->field_0).field_0.b = (uchar)iVar3;
  iVar8 = iVar2 + iVar1;
  iVar6 = iVar2 + uVar5;
  if (0xfe < (int)(iVar2 + uVar5)) {
    iVar6 = 0xff;
  }
  if (iVar6 < 1) {
    iVar6 = iVar10;
  }
  (pDst->field_0).field_0.a = 0xff;
  iVar9 = iVar2 + uVar4;
  if (0xfe < (int)(iVar2 + uVar4)) {
    iVar9 = 0xff;
  }
  pDst[1].field_0.field_0.r = (uchar)iVar6;
  uVar11 = '\0';
  uVar12 = (uchar)iVar9;
  if (iVar9 < 1) {
    uVar12 = uVar11;
  }
  pDst[1].field_0.field_0.g = uVar12;
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  uVar12 = (uchar)iVar8;
  if (iVar8 < 1) {
    uVar12 = uVar11;
  }
  pDst[1].field_0.field_0.b = uVar12;
  pDst[1].field_0.field_0.a = 0xff;
  iVar8 = *(int *)(&DAT_001ac588 + uVar7 * 0x10);
  iVar6 = iVar8 + uVar5;
  iVar9 = iVar8 + iVar1;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  if (iVar6 < 1) {
    iVar6 = iVar10;
  }
  iVar10 = iVar8 + uVar4;
  if (0xfe < (int)(iVar8 + uVar4)) {
    iVar10 = 0xff;
  }
  pDst[2].field_0.field_0.r = (uchar)iVar6;
  uVar12 = (uchar)iVar10;
  if (iVar10 < 1) {
    uVar12 = uVar11;
  }
  pDst[2].field_0.field_0.g = uVar12;
  if (0xfe < iVar9) {
    iVar9 = 0xff;
  }
  uVar12 = (uchar)iVar9;
  if (iVar9 < 1) {
    uVar12 = uVar11;
  }
  pDst[2].field_0.field_0.b = uVar12;
  pDst[2].field_0.field_0.a = 0xff;
  iVar6 = *(int *)(&DAT_001ac58c + uVar7 * 0x10);
  iVar9 = uVar5 + iVar6;
  iVar8 = uVar4 + iVar6;
  iVar6 = iVar6 + iVar1;
  if (0xfe < iVar9) {
    iVar9 = 0xff;
  }
  uVar12 = (uchar)iVar9;
  if (iVar9 < 1) {
    uVar12 = uVar11;
  }
  pDst[3].field_0.field_0.r = uVar12;
  if (0xfe < iVar8) {
    iVar8 = 0xff;
  }
  uVar12 = (uchar)iVar8;
  if (iVar8 < 1) {
    uVar12 = uVar11;
  }
  pDst[3].field_0.field_0.g = uVar12;
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  uVar12 = (uchar)iVar6;
  if (iVar6 < 1) {
    uVar12 = uVar11;
  }
  pDst[3].field_0.field_0.b = uVar12;
  pDst[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void etc1_block::get_diff_subblock_colors(color_quad_u8* pDst, uint16 packed_color5, uint table_idx)
    {
        CRNLIB_ASSERT(table_idx < cETC1IntenModifierValues);
        const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

        uint r, g, b;
        unpack_color5(r, g, b, packed_color5, true);

        const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

        const int y0 = pInten_modifer_table[0];
        pDst[0].set(ir + y0, ig + y0, ib + y0);

        const int y1 = pInten_modifer_table[1];
        pDst[1].set(ir + y1, ig + y1, ib + y1);

        const int y2 = pInten_modifer_table[2];
        pDst[2].set(ir + y2, ig + y2, ib + y2);

        const int y3 = pInten_modifer_table[3];
        pDst[3].set(ir + y3, ig + y3, ib + y3);
    }